

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRAccessChain * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::
allocate<unsigned_int_const&,spv::StorageClass_const&,std::__cxx11::string&,std::__cxx11::string&,unsigned_int&>
          (ObjectPool<spirv_cross::SPIRAccessChain> *this,uint *p,StorageClass *p_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_3,uint *p_4)

{
  Vector<spirv_cross::SPIRAccessChain_*> *this_00;
  TypeID basetype_;
  StorageClass storage_;
  SPIRAccessChain *pSVar1;
  size_t sVar2;
  ulong count;
  bool bVar3;
  SPIRAccessChain *ptr;
  SPIRAccessChain *local_80;
  SPIRAccessChain *local_78;
  string local_70;
  string local_50;
  
  this_00 = &this->vacants;
  sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size;
  if (sVar2 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar1 = (SPIRAccessChain *)malloc(count * 0xa8);
    if (pSVar1 == (SPIRAccessChain *)0x0) {
      return (SPIRAccessChain *)0x0;
    }
    local_78 = pSVar1;
    SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::reserve(this_00,count);
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      local_80 = pSVar1;
      SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::push_back(this_00,&local_80);
      pSVar1 = pSVar1 + 1;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRAccessChain,spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRAccessChain*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRAccessChain,spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>,8ul>
                *)&this->memory,&local_78);
    sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size;
  }
  pSVar1 = (this_00->super_VectorView<spirv_cross::SPIRAccessChain_*>).ptr[sVar2 - 1];
  SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::pop_back(this_00);
  basetype_.id = *p;
  storage_ = *p_1;
  ::std::__cxx11::string::string((string *)&local_50,(string *)p_2);
  ::std::__cxx11::string::string((string *)&local_70,(string *)p_3);
  SPIRAccessChain::SPIRAccessChain(pSVar1,basetype_,storage_,&local_50,&local_70,*p_4);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  return pSVar1;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}